

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_lambdaref_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::BoundLambdaRefExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BoundLambdaRefExpression *this)

{
  string sStack_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if ((this->super_Expression).super_BaseExpression.alias._M_string_length == 0) {
    ::std::__cxx11::to_string(&local_38,(this->binding).table_index);
    ::std::operator+(&local_d8,"#[",&local_38);
    ::std::operator+(&local_b8,&local_d8,".");
    ::std::__cxx11::to_string(&local_f8,(this->binding).column_index);
    ::std::operator+(&local_98,&local_b8,&local_f8);
    ::std::operator+(&local_78,&local_98,".");
    ::std::__cxx11::to_string(&sStack_118,this->lambda_idx);
    ::std::operator+(&local_58,&local_78,&sStack_118);
    ::std::operator+(__return_storage_ptr__,&local_58,"]");
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&sStack_118);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_f8);
    ::std::__cxx11::string::~string((string *)&local_b8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&(this->super_Expression).super_BaseExpression.alias);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoundLambdaRefExpression::ToString() const {
	if (!alias.empty()) {
		return alias;
	}
	return "#[" + to_string(binding.table_index) + "." + to_string(binding.column_index) + "." + to_string(lambda_idx) +
	       "]";
}